

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2-impl.h
# Opt level: O0

uint64_t load64(void *src)

{
  uint64_t w;
  uint8_t *p;
  void *src_local;
  
  return *src;
}

Assistant:

static uint64_t load64( const void *src )
{
#if defined(NATIVE_LITTLE_ENDIAN)
  return *( uint64_t * )( src );
#else
  const uint8_t *p = ( uint8_t * )src;
  uint64_t w = *p++;
  w |= ( uint64_t )( *p++ ) <<  8;
  w |= ( uint64_t )( *p++ ) << 16;
  w |= ( uint64_t )( *p++ ) << 24;
  w |= ( uint64_t )( *p++ ) << 32;
  w |= ( uint64_t )( *p++ ) << 40;
  w |= ( uint64_t )( *p++ ) << 48;
  w |= ( uint64_t )( *p++ ) << 56;
  return w;
#endif
}